

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_do(connectdata *conn,_Bool *done)

{
  CURLcode result;
  _Bool *done_local;
  connectdata *conn_local;
  
  *done = false;
  conn_local._4_4_ = smtp_parse_custom_request(conn);
  if (conn_local._4_4_ == CURLE_OK) {
    conn_local._4_4_ = smtp_regular_transfer(conn,done);
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode smtp_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;

  *done = FALSE; /* default to false */

  /* Parse the custom request */
  result = smtp_parse_custom_request(conn);
  if(result)
    return result;

  result = smtp_regular_transfer(conn, done);

  return result;
}